

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkValidatorUtils.hpp
# Opt level: O0

Result_conflict *
CoreML::validateOutputCount
          (Result_conflict *__return_storage_ptr__,NeuralNetworkLayer *layer,int min,int max)

{
  int iVar1;
  LayerCase LVar2;
  string *psVar3;
  undefined1 local_478 [32];
  undefined1 local_458 [32];
  undefined1 local_438 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  undefined1 local_318 [32];
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined4 local_1b4;
  undefined1 local_1b0 [32];
  undefined1 local_190 [32];
  undefined1 local_170 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_40 [8];
  string err;
  NeuralNetworkLayer *layer_local;
  
  err.super__Rb_tree_node_base._M_right._0_4_ = max;
  err.super__Rb_tree_node_base._M_right._4_4_ = min;
  err._M_storage._M_storage = (uchar  [8])layer;
  if (max < min && -1 < max) {
    __assert_fail("min <= max || max < 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/src/Validation/NeuralNetwork/NeuralNetworkValidatorUtils.hpp"
                  ,0xa2,
                  "Result CoreML::validateOutputCount(const Specification::NeuralNetworkLayer &, int, int)"
                 );
  }
  std::__cxx11::string::string((string *)local_40);
  if ((((int)err.super__Rb_tree_node_base._M_right < 1) ||
      ((int)err.super__Rb_tree_node_base._M_right != err.super__Rb_tree_node_base._M_right._4_4_))
     || (iVar1 = Specification::NeuralNetworkLayer::output_size
                           ((NeuralNetworkLayer *)err._M_storage._M_storage),
        iVar1 == (int)err.super__Rb_tree_node_base._M_right)) {
    if ((err.super__Rb_tree_node_base._M_right._4_4_ < 1) ||
       (iVar1 = Specification::NeuralNetworkLayer::output_size
                          ((NeuralNetworkLayer *)err._M_storage._M_storage),
       err.super__Rb_tree_node_base._M_right._4_4_ <= iVar1)) {
      if (((int)err.super__Rb_tree_node_base._M_right < 1) ||
         (iVar1 = Specification::NeuralNetworkLayer::output_size
                            ((NeuralNetworkLayer *)err._M_storage._M_storage),
         iVar1 <= (int)err.super__Rb_tree_node_base._M_right)) {
        Result::Result((Result *)__return_storage_ptr__);
      }
      else {
        psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)err._M_storage._M_storage);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_438 + 0x20),"Layer \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3);
        std::operator+(&local_3f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_438 + 0x20),"\' of type ");
        LVar2 = Specification::NeuralNetworkLayer::layer_case
                          ((NeuralNetworkLayer *)err._M_storage._M_storage);
        std::__cxx11::to_string((string *)local_438,LVar2);
        std::operator+(&local_3d8,&local_3f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_438);
        std::operator+(&local_3b8,&local_3d8," has ");
        iVar1 = Specification::NeuralNetworkLayer::output_size
                          ((NeuralNetworkLayer *)err._M_storage._M_storage);
        std::__cxx11::to_string((string *)local_458,iVar1);
        std::operator+(&local_398,&local_3b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_458);
        std::operator+(&local_378,&local_398," outputs but expects at most ");
        std::__cxx11::to_string((string *)local_478,(int)err.super__Rb_tree_node_base._M_right);
        std::operator+(&local_358,&local_378,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_478);
        std::operator+(&local_338,&local_358,".");
        std::__cxx11::string::operator=((string *)local_40,(string *)&local_338);
        std::__cxx11::string::~string((string *)&local_338);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)local_478);
        std::__cxx11::string::~string((string *)&local_378);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)local_458);
        std::__cxx11::string::~string((string *)&local_3b8);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::__cxx11::string::~string((string *)local_438);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::__cxx11::string::~string((string *)(local_438 + 0x20));
        Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_40)
        ;
      }
    }
    else {
      psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                         ((NeuralNetworkLayer *)err._M_storage._M_storage);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_2d8 + 0x20),"Layer \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3);
      std::operator+(&local_298,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_2d8 + 0x20),"\' of type ");
      LVar2 = Specification::NeuralNetworkLayer::layer_case
                        ((NeuralNetworkLayer *)err._M_storage._M_storage);
      std::__cxx11::to_string((string *)local_2d8,LVar2);
      std::operator+(&local_278,&local_298,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8)
      ;
      std::operator+(&local_258,&local_278," has ");
      iVar1 = Specification::NeuralNetworkLayer::output_size
                        ((NeuralNetworkLayer *)err._M_storage._M_storage);
      std::__cxx11::to_string((string *)local_2f8,iVar1);
      std::operator+(&local_238,&local_258,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8)
      ;
      std::operator+(&local_218,&local_238," outputs but expects at least ");
      std::__cxx11::to_string((string *)local_318,err.super__Rb_tree_node_base._M_right._4_4_);
      std::operator+(&local_1f8,&local_218,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318)
      ;
      std::operator+(&local_1d8,&local_1f8,".");
      std::__cxx11::string::operator=((string *)local_40,(string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)local_318);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)local_2f8);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)local_2d8);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)(local_2d8 + 0x20));
      Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_40);
    }
  }
  else {
    psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                       ((NeuralNetworkLayer *)err._M_storage._M_storage);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_170 + 0x20),"Layer \'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3);
    std::operator+(&local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_170 + 0x20),"\' of type ");
    LVar2 = Specification::NeuralNetworkLayer::layer_case
                      ((NeuralNetworkLayer *)err._M_storage._M_storage);
    std::__cxx11::to_string((string *)local_170,LVar2);
    std::operator+(&local_110,&local_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_170);
    std::operator+(&local_f0,&local_110," has ");
    iVar1 = Specification::NeuralNetworkLayer::output_size
                      ((NeuralNetworkLayer *)err._M_storage._M_storage);
    std::__cxx11::to_string((string *)local_190,iVar1);
    std::operator+(&local_d0,&local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190);
    std::operator+(&local_b0,&local_d0," outputs but expects exactly ");
    std::__cxx11::to_string((string *)local_1b0,err.super__Rb_tree_node_base._M_right._4_4_);
    std::operator+(&local_90,&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    std::operator+(&local_70,&local_90,".");
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)local_1b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)local_190);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)(local_170 + 0x20));
    Result::Result((Result *)__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_40);
  }
  local_1b4 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateOutputCount(const Specification::NeuralNetworkLayer& layer, int min, int max) {
    
    assert( min <= max || max < 0 );
    std::string err;
    
    if (max > 0 && max == min && layer.output_size() != max) {
        err = "Layer '" + layer.name() + "' of type " + std::to_string(layer.layer_case()) + + " has " + std::to_string(layer.output_size()) + " outputs but expects exactly " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (min > 0 && layer.output_size() < min) {
        err = "Layer '" + layer.name() + "' of type " + std::to_string(layer.layer_case()) + + " has " + std::to_string(layer.output_size()) + " outputs but expects at least " + std::to_string(min) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else if (max > 0 && layer.output_size() > max) {
        err = "Layer '" + layer.name() + "' of type " + std::to_string(layer.layer_case()) + " has " + std::to_string(layer.output_size()) + " outputs but expects at most " + std::to_string(max) + ".";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    else {
        return Result();
    }
}